

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader15.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader15::begin__IDREF_array
          (LibraryControllersLoader15 *this,IDREF_array__AttributeData *attributeData)

{
  byte bVar1;
  uint *in_RSI;
  long in_RDI;
  bool bVar2;
  IDREF_array__AttributeData attrData;
  uint local_30 [2];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_28 = *(undefined8 *)(in_RSI + 2);
  local_20 = *(undefined8 *)(in_RSI + 4);
  bVar2 = (*in_RSI & 1) == 1;
  if (bVar2) {
    local_18 = *(undefined8 *)(in_RSI + 6);
  }
  local_30[0] = (uint)bVar2;
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x170))(*(long **)(in_RDI + 0x20),local_30);
  return (bool)(bVar1 & 1);
}

Assistant:

bool LibraryControllersLoader15::begin__IDREF_array( const COLLADASaxFWL15::IDREF_array__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__IDREF_array(attributeData));
COLLADASaxFWL::IDREF_array__AttributeData attrData;
attrData.present_attributes = 0;
attrData.id = attributeData.id;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::IDREF_array__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL15::IDREF_array__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::IDREF_array__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__IDREF_array(attrData);
}